

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  IUINT32 *pIVar1;
  IQUEUEHEAD *pIVar2;
  byte bVar3;
  byte bVar4;
  IUINT32 IVar5;
  uint uVar6;
  IUINT32 IVar7;
  IQUEUEHEAD *pIVar8;
  IUINT32 *__ptr;
  long lVar9;
  bool bVar10;
  IUINT32 IVar11;
  uint uVar12;
  ulong __n;
  IUINT32 *pIVar13;
  IQUEUEHEAD *pIVar14;
  IKCPSEG *newseg;
  uint uVar15;
  uint uVar16;
  int iVar17;
  IKCPSEG *seg;
  IQUEUEHEAD *pIVar18;
  uint uVar19;
  IUINT32 IVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint local_78;
  
  IVar5 = kcp->snd_una;
  if (((kcp->logmask & 2) != 0) && (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)
     ) {
    ikcp_log(kcp,2,"[RI] %d bytes",size & 0xffffffff);
  }
  if ((int)size < 0x18 || data == (char *)0x0) {
LAB_00138f5a:
    iVar17 = -1;
  }
  else {
    if (size < 0x18) {
      IVar11 = kcp->snd_una;
    }
    else {
      pIVar2 = &kcp->snd_buf;
      pIVar1 = &kcp->snd_nxt;
      bVar10 = false;
      local_78 = 0;
      do {
        IVar11 = *(IUINT32 *)data;
        if (IVar11 != kcp->conv) goto LAB_00138f5a;
        uVar16 = *(uint *)((long)data + 0x14);
        __n = (ulong)uVar16;
        if ((int)uVar16 < 0) {
          return -2;
        }
        uVar24 = size - 0x18;
        size = uVar24 - __n;
        if (uVar24 < __n) {
          return -2;
        }
        bVar3 = (byte)*(IUINT32 *)((long)data + 4);
        if ((byte)(bVar3 + 0xab) < 0xfc) {
          return -3;
        }
        bVar4 = *(byte *)((long)data + 5);
        uVar15 = *(uint *)((long)data + 8);
        uVar6 = *(uint *)((long)data + 0xc);
        IVar7 = *(IUINT32 *)((long)data + 0x10);
        uVar21 = (uint)*(ushort *)((long)data + 6);
        kcp->rmt_wnd = uVar21;
        pIVar18 = (kcp->snd_buf).next;
        if (pIVar18 != pIVar2) {
          do {
            if ((int)(IVar7 - *(int *)((long)&pIVar18[2].next + 4)) < 1) break;
            pIVar14 = pIVar18->next;
            pIVar8 = pIVar18->prev;
            pIVar14->prev = pIVar8;
            pIVar8->next = pIVar14;
            pIVar18->next = (IQUEUEHEAD *)0x0;
            pIVar18->prev = (IQUEUEHEAD *)0x0;
            if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
              free(pIVar18);
            }
            else {
              (*ikcp_free_hook)(pIVar18);
            }
            kcp->nsnd_buf = kcp->nsnd_buf - 1;
            pIVar18 = pIVar14;
          } while (pIVar14 != pIVar2);
          pIVar18 = pIVar2->next;
        }
        pIVar13 = (IUINT32 *)((long)&pIVar18[2].next + 4);
        if (pIVar18 == pIVar2) {
          pIVar13 = pIVar1;
        }
        IVar20 = *pIVar13;
        kcp->snd_una = IVar20;
        if (3 < bVar3 - 0x51) {
          return -3;
        }
        switch((uint)bVar3) {
        case 0x51:
          if (((kcp->logmask & 0x10) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x10,"input psh: sn=%lu ts=%lu",(ulong)uVar6,(ulong)uVar15);
          }
          if ((int)(uVar6 - (kcp->rcv_nxt + kcp->rcv_wnd)) < 0) {
            IVar20 = kcp->ackcount;
            if (kcp->ackblock < IVar20 + 1) {
              uVar19 = 8;
              do {
                uVar12 = uVar19;
                uVar19 = uVar12 * 2;
              } while (uVar12 < IVar20 + 1);
              if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                pIVar13 = (IUINT32 *)malloc((ulong)uVar12 << 3);
              }
              else {
                pIVar13 = (IUINT32 *)(*ikcp_malloc_hook)((ulong)uVar12 << 3);
              }
              if (pIVar13 == (IUINT32 *)0x0) {
                __assert_fail("acklist != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                              ,0x28a,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
              }
              __ptr = kcp->acklist;
              if (__ptr != (IUINT32 *)0x0) {
                if (kcp->ackcount != 0) {
                  uVar19 = 1;
                  uVar24 = 0;
                  do {
                    pIVar13[uVar19 - 1] = __ptr[uVar19 - 1];
                    pIVar13[uVar19] = __ptr[uVar19];
                    uVar24 = uVar24 + 1;
                    uVar19 = uVar19 + 2;
                  } while (uVar24 < kcp->ackcount);
                }
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(__ptr);
                }
                else {
                  (*ikcp_free_hook)(__ptr);
                }
              }
              kcp->acklist = pIVar13;
              kcp->ackblock = uVar12;
              IVar20 = kcp->ackcount;
            }
            else {
              pIVar13 = kcp->acklist;
            }
            pIVar13[IVar20 * 2] = uVar6;
            pIVar13[(ulong)(IVar20 * 2) + 1] = uVar15;
            kcp->ackcount = kcp->ackcount + 1;
            if (-1 < (int)(uVar6 - kcp->rcv_nxt)) {
              if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                newseg = (IKCPSEG *)malloc(__n + 0x48);
              }
              else {
                newseg = (IKCPSEG *)(*ikcp_malloc_hook)(__n + 0x48);
              }
              newseg->conv = IVar11;
              newseg->cmd = 0x51;
              newseg->frg = (uint)bVar4;
              newseg->wnd = uVar21;
              newseg->ts = uVar15;
              newseg->sn = uVar6;
              newseg->una = IVar7;
              newseg->len = uVar16;
              if (uVar16 != 0) {
                memcpy(newseg->data,(IUINT32 *)((long)data + 0x18),__n);
              }
              ikcp_parse_data(kcp,newseg);
            }
          }
          break;
        case 0x52:
          uVar16 = kcp->current - uVar15;
          if (-1 < (int)uVar16) {
            iVar17 = kcp->rx_srtt;
            if (iVar17 == 0) {
              kcp->rx_srtt = uVar16;
              uVar21 = uVar16 >> 1;
              kcp->rx_rttval = uVar21;
            }
            else {
              uVar19 = uVar16 - iVar17;
              uVar21 = -uVar19;
              if (0 < (int)uVar19) {
                uVar21 = uVar19;
              }
              lVar9 = (long)kcp->rx_rttval * 3;
              uVar23 = lVar9 + (ulong)uVar21;
              uVar24 = (ulong)uVar21 + lVar9 + 3;
              if (-1 < (long)uVar23) {
                uVar24 = uVar23;
              }
              uVar21 = (uint)(uVar24 >> 2);
              kcp->rx_rttval = uVar21;
              iVar22 = iVar17 * 7 + uVar16;
              iVar17 = iVar17 * 7 + 7 + uVar16;
              if (-1 < iVar22) {
                iVar17 = iVar22;
              }
              uVar16 = iVar17 >> 3;
              if (iVar22 < 8) {
                uVar16 = 1;
              }
              kcp->rx_srtt = uVar16;
            }
            uVar19 = uVar21 * 4;
            if (uVar21 * 4 < kcp->interval) {
              uVar19 = kcp->interval;
            }
            uVar21 = uVar19 + uVar16;
            if (uVar19 + uVar16 < (uint)kcp->rx_minrto) {
              uVar21 = kcp->rx_minrto;
            }
            if (59999 < uVar21) {
              uVar21 = 60000;
            }
            kcp->rx_rto = uVar21;
          }
          if ((-1 < (int)(uVar6 - IVar20)) && (pIVar14 = pIVar18, (int)(uVar6 - *pIVar1) < 0)) {
            do {
              if (pIVar14 == pIVar2) break;
              pIVar8 = pIVar14->next;
              uVar16 = *(uint *)((long)&pIVar14[2].next + 4);
              if (uVar6 == uVar16) {
                pIVar18 = pIVar14->prev;
                pIVar8->prev = pIVar18;
                pIVar18->next = pIVar8;
                pIVar14->next = (IQUEUEHEAD *)0x0;
                pIVar14->prev = (IQUEUEHEAD *)0x0;
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(pIVar14);
                }
                else {
                  (*ikcp_free_hook)(pIVar14);
                }
                kcp->nsnd_buf = kcp->nsnd_buf - 1;
                pIVar18 = (kcp->snd_buf).next;
                break;
              }
              pIVar14 = pIVar8;
            } while (-1 < (int)(uVar6 - uVar16));
          }
          pIVar13 = (IUINT32 *)((long)&pIVar18[2].next + 4);
          if (pIVar18 == pIVar2) {
            pIVar13 = pIVar1;
          }
          if (0 < (int)(uVar6 - local_78)) {
            local_78 = uVar6;
          }
          if (!bVar10) {
            local_78 = uVar6;
          }
          kcp->snd_una = *pIVar13;
          bVar10 = true;
          if (((kcp->logmask & 0x20) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x20,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)uVar6,
                     (long)(int)(kcp->current - uVar15),(long)kcp->rx_rto);
          }
          break;
        case 0x53:
          *(byte *)&kcp->probe = (byte)kcp->probe | 2;
          if (((kcp->logmask & 0x40) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x40,"input probe");
          }
          break;
        case 0x54:
          if (((kcp->logmask & 0x80) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x80,"input wins: %lu",(ulong)uVar21);
          }
        }
        data = (char *)((long)data + 0x18 + __n);
      } while (0x17 < size);
      IVar11 = kcp->snd_una;
      if (((bVar10) && (-1 < (int)(local_78 - IVar11))) && ((int)(local_78 - kcp->snd_nxt) < 0)) {
        pIVar18 = (kcp->snd_buf).next;
        while ((pIVar18 != pIVar2 &&
               (uVar16 = *(uint *)((long)&pIVar18[2].next + 4), -1 < (int)(local_78 - uVar16)))) {
          if (local_78 != uVar16) {
            *(int *)&pIVar18[3].prev = *(int *)&pIVar18[3].prev + 1;
          }
          pIVar18 = pIVar18->next;
        }
      }
    }
    iVar17 = 0;
    if (0 < (int)(IVar11 - IVar5)) {
      uVar16 = kcp->rmt_wnd;
      uVar15 = kcp->cwnd;
      if (uVar15 < uVar16) {
        uVar6 = kcp->mss;
        if (uVar15 < kcp->ssthresh) {
          uVar15 = uVar15 + 1;
          kcp->cwnd = uVar15;
          kcp->incr = kcp->incr + uVar6;
        }
        else {
          uVar21 = kcp->incr;
          if (kcp->incr <= uVar6) {
            uVar21 = uVar6;
          }
          uVar21 = (uVar6 >> 4) + uVar21 + (uVar6 * uVar6) / uVar21;
          kcp->incr = uVar21;
          if ((uVar15 + 1) * uVar6 <= uVar21) {
            uVar15 = ((uVar6 + uVar21) - 1) / (uVar6 + (uVar6 == 0));
            kcp->cwnd = uVar15;
          }
        }
        iVar17 = 0;
        if (uVar16 < uVar15) {
          kcp->cwnd = uVar16;
          kcp->incr = uVar6 * uVar16;
        }
      }
    }
  }
  return iVar17;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 prev_una = kcp->snd_una;
	IUINT32 maxack = 0, latest_ts = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", (int)size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len || (int)len < 0) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
				latest_ts = ts;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
				#ifndef IKCP_FASTACK_CONSERVE
					maxack = sn;
					latest_ts = ts;
				#else
					if (_itimediff(ts, latest_ts) > 0) {
						maxack = sn;
						latest_ts = ts;
					}
				#endif
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_ACK, 
					"input ack: sn=%lu rtt=%ld rto=%ld", (unsigned long)sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", (unsigned long)sn, (unsigned long)ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (unsigned long)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack, latest_ts);
	}

	if (_itimediff(kcp->snd_una, prev_una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
				#if 1
					kcp->cwnd = (kcp->incr + mss - 1) / ((mss > 0)? mss : 1);
				#else
					kcp->cwnd++;
				#endif
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}